

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SchemaValidator.cpp
# Opt level: O2

void __thiscall xercesc_4_0::SchemaValidator::~SchemaValidator(SchemaValidator *this)

{
  void *in_RSI;
  
  ~SchemaValidator(this);
  XMemory::operator_delete((XMemory *)this,in_RSI);
  return;
}

Assistant:

SchemaValidator::~SchemaValidator()
{
    delete fXsiType;
    delete fTypeStack;

    if (fNotationBuf)
        delete fNotationBuf;
}